

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O2

void abort_save_pos_for_undo_proc(Am_Object *command_obj)

{
  Am_Value *in_value;
  Am_Object scrollbar;
  Am_Value old_value;
  Am_Object scroll_command;
  Am_Object local_18;
  
  Am_Object::Am_Object(&local_18,command_obj);
  clear_save_pos_for_undo_proc(&local_18);
  Am_Object::~Am_Object(&local_18);
  Am_Object::Get_Owner((Am_Object *)&old_value,(Am_Slot_Flags)command_obj);
  Am_Object::Get_Owner(&scrollbar,(Am_Slot_Flags)&old_value);
  Am_Object::~Am_Object((Am_Object *)&old_value);
  Am_Object::Get_Object(&scroll_command,(Am_Slot_Key)&scrollbar,0xc5);
  old_value.type = 0;
  old_value.value.wrapper_value = (Am_Wrapper *)0x0;
  in_value = Am_Object::Get(&scroll_command,0x16c,1);
  Am_Value::operator=(&old_value,in_value);
  Am_Object::Set(&scrollbar,0x169,&old_value,0);
  Am_Value::~Am_Value(&old_value);
  Am_Object::~Am_Object(&scroll_command);
  Am_Object::~Am_Object(&scrollbar);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, abort_save_pos_for_undo,
                 (Am_Object command_obj))
{
  clear_save_pos_for_undo_proc(command_obj);
  //first owner is the interactor
  Am_Object scrollbar = command_obj.Get_Owner().Get_Owner();
  Am_Object scroll_command = scrollbar.Get_Object(Am_COMMAND);
  Am_Value old_value;
  old_value = scroll_command.Peek(Am_OLD_VALUE);
  scrollbar.Set(Am_VALUE, old_value);
  // std::cout << "...Aborting, setting " << scrollbar << " value with " <<
  //   old_value  << " from " << scroll_command <<std::endl <<std::flush;
}